

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

bool __thiscall
kj::Function<bool_(capnp::MessageBuilder_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1765:35)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1765:35)>
             *this,MessageBuilder *params)

{
  uint *puVar1;
  int iVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  DebugExpression<bool> _kjCondition_1;
  Fault f;
  Reader desc;
  Reader call;
  Reader message;
  Reader capTable;
  bool local_120 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> local_118;
  StructReader local_e8;
  StructReader local_b8;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  short *local_78;
  byte *local_70;
  uint local_68;
  short local_64;
  ListElementCount local_60;
  ListReader local_58;
  
  capnp::MessageBuilder::getRootInternal((Builder *)&local_e8,params);
  local_58.ptr = (byte *)local_e8.data;
  local_58.capTable = local_e8.capTable;
  capnp::_::PointerBuilder::getStruct
            ((StructBuilder *)&local_b8,(PointerBuilder *)&local_58,(StructSize)0x10001,(word *)0x0)
  ;
  capnp::_::StructBuilder::asReader((StructBuilder *)&local_b8);
  if ((0xf < local_68) && (*local_78 == 2)) {
    bVar3 = local_64 == 0;
    local_58.ptr = local_70;
    if (bVar3) {
      local_58.ptr = (byte *)0x0;
    }
    local_58.elementCount = 0x7fffffff;
    if (!bVar3) {
      local_58.elementCount = local_60;
    }
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    if (!bVar3) {
      uVar4 = local_88;
      uVar5 = uStack_84;
      uVar6 = uStack_80;
      uVar7 = uStack_7c;
    }
    local_58.segment = (SegmentReader *)CONCAT44(uVar5,uVar4);
    local_58.capTable = (CapTableReader *)CONCAT44(uVar7,uVar6);
    capnp::_::PointerReader::getStruct(&local_b8,(PointerReader *)&local_58,(word *)0x0);
    if (((0x7f < local_b8.dataSize) && (*(long *)((long)local_b8.data + 8) == -0x2238f40687becc31))
       && (*(short *)((long)local_b8.data + 4) == 0)) {
      local_118.op.content.ptr = (char *)(local_b8.pointers + 1);
      if (local_b8.pointerCount < 2) {
        local_118.op.content.ptr = (char *)(WirePointer *)0x0;
      }
      if (local_b8.pointerCount < 2) {
        local_b8.nestingLimit = 0x7fffffff;
        local_b8.segment._0_4_ = 0;
        local_b8.segment._4_4_ = 0;
        local_b8.capTable._0_4_ = 0;
        local_b8.capTable._4_4_ = 0;
      }
      local_118.right = (uint *)CONCAT44(local_b8.capTable._4_4_,local_b8.capTable._0_4_);
      local_118.left = (uint)local_b8.segment;
      local_118._4_4_ = local_b8.segment._4_4_;
      local_118.op.content.size_._0_4_ = local_b8.nestingLimit;
      capnp::_::PointerReader::getStruct(&local_e8,(PointerReader *)&local_118,(word *)0x0);
      local_118.op.content.ptr = (char *)0x0;
      iVar2 = 0x7fffffff;
      if (1 < local_e8.pointerCount) {
        local_118.op.content.ptr =
             (char *)(CONCAT71(local_e8.pointers._1_7_,local_e8.pointers._0_1_) + 8);
        iVar2 = local_e8.nestingLimit;
      }
      local_118.left = 0;
      local_118._4_4_ = 0;
      uVar4 = 0;
      uVar5 = 0;
      if (1 < local_e8.pointerCount) {
        local_118.left = (uint)local_e8.segment;
        local_118._4_4_ = local_e8.segment._4_4_;
        uVar4 = local_e8.capTable._0_4_;
        uVar5 = local_e8.capTable._4_4_;
      }
      local_118.right = (uint *)CONCAT44(uVar5,uVar4);
      local_118.op.content.size_ = CONCAT44(local_118.op.content.size_._4_4_,iVar2);
      capnp::_::PointerReader::getList
                (&local_58,(PointerReader *)&local_118,INLINE_COMPOSITE,(word *)0x0);
      local_e8.segment._0_4_ = local_58.elementCount;
      local_e8.segment._4_4_ = 1;
      local_e8.capTable = (CapTableReader *)0x4d6514;
      local_e8.data = &DAT_00000005;
      local_e8.pointers._0_1_ = local_58.elementCount == 1;
      if (!(bool)local_e8.pointers._0_1_) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
                  ((Fault *)&local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x6ee,FAILED,"capTable.size() == 1","_kjCondition,",
                   (DebugComparison<unsigned_int,_int> *)&local_e8);
        kj::_::Debug::Fault::fatal((Fault *)&local_118);
      }
      capnp::_::ListReader::getStructElement(&local_e8,&local_58,0);
      if (*(this->f).exportIsPromise == true) {
        if (local_e8.dataSize < 0x10) {
          local_120[0] = false;
LAB_0021c27a:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)&local_118,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                     ,0x6f1,FAILED,"desc.isSenderPromise()","_kjCondition,",
                     (DebugExpression<bool> *)local_120);
          kj::_::Debug::Fault::fatal((Fault *)&local_118);
        }
        local_120[0] = *local_e8.data == 2;
        if (!local_120[0]) goto LAB_0021c27a;
        local_118.left = 0;
        if (0x3f < local_e8.dataSize) {
          local_118.left = *(uint *)((long)local_e8.data + 4);
        }
        local_118.right = (this->f).expectedExportNumber;
        local_118.result = local_118.left == *local_118.right;
        local_118.op.content.ptr = " == ";
        local_118.op.content.size_ = 5;
        if (!local_118.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&>
                    ((Fault *)local_120,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                     ,0x6f2,FAILED,"desc.getSenderPromise() == expectedExportNumber","_kjCondition,"
                     ,&local_118);
          kj::_::Debug::Fault::fatal((Fault *)local_120);
        }
      }
      else {
        if (local_e8.dataSize < 0x10) {
          local_120[0] = false;
LAB_0021c2b9:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)&local_118,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                     ,0x6f4,FAILED,"desc.isSenderHosted()","_kjCondition,",
                     (DebugExpression<bool> *)local_120);
          kj::_::Debug::Fault::fatal((Fault *)&local_118);
        }
        local_120[0] = *local_e8.data == 1;
        if (!local_120[0]) goto LAB_0021c2b9;
        local_118.left = 0;
        if (0x3f < local_e8.dataSize) {
          local_118.left = *(uint *)((long)local_e8.data + 4);
        }
        local_118.right = (this->f).expectedExportNumber;
        local_118.result = local_118.left == *local_118.right;
        local_118.op.content.ptr = " == ";
        local_118.op.content.size_ = 5;
        if (!local_118.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&>
                    ((Fault *)local_120,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                     ,0x6f5,FAILED,"desc.getSenderHosted() == expectedExportNumber","_kjCondition,",
                     &local_118);
          kj::_::Debug::Fault::fatal((Fault *)local_120);
        }
      }
      puVar1 = (this->f).interceptCount;
      *puVar1 = *puVar1 + 1;
    }
  }
  return true;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }